

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O2

el_action_t vi_change_to_eol(EditLine *el,wint_t c)

{
  wchar_t *ptr;
  
  cv_undo(el);
  ptr = (el->el_line).cursor;
  cv_yank(el,ptr,(wchar_t)((ulong)((long)(el->el_line).lastchar - (long)ptr) >> 2));
  ed_kill_line(el,0);
  (el->el_map).current = (el->el_map).key;
  return '\x04';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_change_to_eol(EditLine *el, wint_t c __attribute__((__unused__)))
{

	cv_undo(el);
	cv_yank(el, el->el_line.cursor,
	    (int)(el->el_line.lastchar - el->el_line.cursor));
	(void) ed_kill_line(el, 0);
	el->el_map.current = el->el_map.key;
	return CC_REFRESH;
}